

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  undefined8 *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  undefined8 uVar5;
  int iVar6;
  DataKey DVar7;
  long lVar8;
  int iVar9;
  uint *puVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  uint *puVar13;
  devexpr *pdVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_2ec;
  cpp_dec_float<200U,_int,_void> local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar19 = 0;
  DVar7.info = 0;
  DVar7.idx = -1;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = (int)((ulong)((long)(pSVar2->coWeights).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3) >> 7);
  if (start < iVar9) {
    pnVar4 = (pSVar2->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar18 = (long)start;
    uVar17 = lVar18 << 7 | 0x78;
    local_2ec = -1;
    do {
      puVar1 = (undefined8 *)((long)&(pnVar4->m_backend).data + uVar17);
      puVar13 = (uint *)(puVar1 + -0xf);
      pcVar12 = &local_2b0;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar12->data)._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
      }
      local_2b0.exp = *(int *)(puVar1 + -1);
      local_2b0.neg = *(bool *)((long)puVar1 + -4);
      local_2b0._120_8_ = *puVar1;
      pnVar11 = feastol;
      pcVar12 = &local_230;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
      }
      local_230.exp = (feastol->m_backend).exp;
      local_230.neg = (feastol->m_backend).neg;
      local_230.fpclass = (feastol->m_backend).fpclass;
      local_230.prec_elem = (feastol->m_backend).prec_elem;
      if (local_230.data._M_elems[0] != 0 || local_230.fpclass != cpp_dec_float_finite) {
        local_230.neg = (bool)(local_230.neg ^ 1);
      }
      if ((local_2b0.fpclass != cpp_dec_float_NaN && local_230.fpclass != cpp_dec_float_NaN) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2b0,&local_230), iVar6 < 0)) {
        pcVar12 = &local_2b0;
        pdVar14 = local_b0;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(uint *)pdVar14 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
          pdVar14 = pdVar14 + (ulong)bVar19 * -8 + 4;
        }
        local_40 = local_2b0.exp;
        local_3c = local_2b0.neg;
        local_38 = local_2b0.fpclass;
        iStack_34 = local_2b0.prec_elem;
        puVar13 = (uint *)((long)&(pnVar3->m_backend).data + (uVar17 - 0x78));
        puVar10 = puVar13;
        pnVar11 = &local_130;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = *puVar10;
          puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = puVar13[0x1c];
        local_130.m_backend.neg = SUB41(puVar13[0x1d],0);
        local_130.m_backend.fpclass = puVar13[0x1e];
        local_130.m_backend.prec_elem = puVar13[0x1f];
        pnVar11 = feastol;
        pnVar15 = &local_1b0;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_230,local_b0,&local_130,&local_1b0,&local_130);
        pcVar12 = &local_230;
        pcVar16 = &local_2b0;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar16->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
        }
        local_2b0.exp = local_230.exp;
        local_2b0.neg = local_230.neg;
        local_2b0.fpclass = local_230.fpclass;
        local_2b0.prec_elem = local_230.prec_elem;
        if (((local_230.fpclass != cpp_dec_float_NaN) &&
            ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_2b0,&best->m_backend), 0 < iVar6)) {
          pcVar12 = &local_2b0;
          pnVar11 = best;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pnVar11->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
          }
          (best->m_backend).exp = local_2b0.exp;
          (best->m_backend).neg = local_2b0.neg;
          (best->m_backend).fpclass = local_2b0.fpclass;
          (best->m_backend).prec_elem = local_2b0.prec_elem;
          pnVar11 = &this->last;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pnVar11->m_backend).data._M_elems[0] = *puVar13;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + (ulong)bVar19 * -8 + 4);
          }
          (this->last).m_backend.exp = *(int *)((long)&(pnVar3->m_backend).data + (uVar17 - 8));
          (this->last).m_backend.neg = *(bool *)((long)&(pnVar3->m_backend).data + (uVar17 - 4));
          uVar5 = *(undefined8 *)((long)&(pnVar3->m_backend).data + uVar17);
          (this->last).m_backend.fpclass = (int)uVar5;
          (this->last).m_backend.prec_elem = (int)((ulong)uVar5 >> 0x20);
          local_2ec = (int)lVar18;
        }
      }
      lVar18 = lVar18 + incr;
      uVar17 = uVar17 + (long)incr * 0x80;
    } while (lVar18 < iVar9);
    DVar7.info = 0;
    DVar7.idx = -1;
    if (-1 < local_2ec) {
      DVar7 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::coId((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,local_2ec);
    }
  }
  return (SPxId)DVar7;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseDim(R& best, R feastol, int start, int incr)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int end = this->thesolver->coWeights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->coTest().dim());

   for(; start < end; start += incr)
   {
      x = cTest[start];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = cpen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}